

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

ValueType *
HighsHashTree<std::pair<int,_int>,_double>::find_recurse
          (NodePtr node,uint64_t hash,int hashPos,pair<int,_int> *key)

{
  ulong uVar1;
  ValueType *pVVar2;
  sbyte sVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  int iVar8;
  undefined1 auVar7 [16];
  
  do {
    uVar4 = (uint)node.ptrAndType & 7;
    iVar5 = (&switchD_0032ef21::switchdataD_003d7ee4)[uVar4] + 0x3d7ee4;
    switch(uVar4) {
    case 0:
      goto switchD_0032ef21_caseD_0;
    case 1:
      plVar6 = (long *)(node.ptrAndType & 0xfffffffffffffff8);
      do {
        auVar7._0_4_ = -(uint)((int)plVar6[1] == (*key).first);
        iVar8 = -(uint)((int)((ulong)plVar6[1] >> 0x20) == (*key).second);
        auVar7._4_4_ = auVar7._0_4_;
        auVar7._8_4_ = iVar8;
        auVar7._12_4_ = iVar8;
        iVar5 = movmskpd(iVar5,auVar7);
        if (iVar5 == 3) {
          return (ValueType *)(plVar6 + 2);
        }
        plVar6 = (long *)*plVar6;
      } while (plVar6 != (long *)0x0);
switchD_0032ef21_caseD_0:
      return (ValueType *)0x0;
    case 2:
      pVVar2 = InnerLeaf<1>::find_entry
                         ((InnerLeaf<1> *)(node.ptrAndType & 0xfffffffffffffff8),hash,hashPos,key);
      return pVVar2;
    case 3:
      pVVar2 = InnerLeaf<2>::find_entry
                         ((InnerLeaf<2> *)(node.ptrAndType & 0xfffffffffffffff8),hash,hashPos,key);
      return pVVar2;
    case 4:
      pVVar2 = InnerLeaf<3>::find_entry
                         ((InnerLeaf<3> *)(node.ptrAndType & 0xfffffffffffffff8),hash,hashPos,key);
      return pVVar2;
    case 5:
      pVVar2 = InnerLeaf<4>::find_entry
                         ((InnerLeaf<4> *)(node.ptrAndType & 0xfffffffffffffff8),hash,hashPos,key);
      return pVVar2;
    case 6:
      uVar4 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
      uVar1 = *(ulong *)(node.ptrAndType & 0xfffffffffffffff8);
      sVar3 = (sbyte)uVar4;
      if ((uVar1 >> uVar4 & 1) != 0) {
        node.ptrAndType =
             ((ulong *)(node.ptrAndType & 0xfffffffffffffff8))[POPCOUNT(uVar1 >> sVar3)];
        hashPos = hashPos + 1;
      }
      if ((uVar1 & 1L << sVar3) != 0) break;
      goto switchD_0032ef21_caseD_0;
    }
  } while( true );
}

Assistant:

static const ValueType* find_recurse(NodePtr node, uint64_t hash, int hashPos,
                                       const K& key) {
    int startPos = hashPos;
    switch (node.getType()) {
      case kEmpty:
        return nullptr;
      case kListLeaf: {
        ListLeaf* leaf = node.getListLeaf();
        ListNode* iter = &leaf->first;
        do {
          if (iter->entry.key() == key) return &iter->entry.value();
          iter = iter->next;
        } while (iter != nullptr);
        return nullptr;
      }
      case kInnerLeafSizeClass1: {
        InnerLeaf<1>* leaf = node.getInnerLeafSizeClass1();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kInnerLeafSizeClass2: {
        InnerLeaf<2>* leaf = node.getInnerLeafSizeClass2();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kInnerLeafSizeClass3: {
        InnerLeaf<3>* leaf = node.getInnerLeafSizeClass3();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = node.getInnerLeafSizeClass4();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kBranchNode: {
        BranchNode* branch = node.getBranchNode();
        if (!branch->occupation.test(get_hash_chunk(hash, hashPos)))
          return nullptr;
        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
        node = branch->child[location];
        ++hashPos;
      }
    }

    assert(hashPos > startPos);

    return find_recurse(node, hash, hashPos, key);
  }